

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<std::pair<unsigned_int,_unsigned_int>_>
metaf::fractionStrToUint(string *str,size_t startPos,size_t length)

{
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var1;
  char cVar2;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var3;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var12;
  optional<std::pair<unsigned_int,_unsigned_int>_> oVar13;
  
  sVar11 = str->_M_string_length - startPos;
  if (length + startPos <= str->_M_string_length) {
    sVar11 = length;
  }
  _Var4 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
          std::__cxx11::string::find((char)str,0x2f);
  if ((_Var4 != (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0xffffffffffffffff) &&
     ((long)_Var4 - startPos < 3 &&
      _Var4 != (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)startPos)) {
    _Var12 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)(sVar11 + startPos);
    _Var1 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)((long)_Var4 + 1);
    if ((ulong)((long)_Var12 - (long)_Var1) < 3 && _Var12 != _Var1) {
      _Var3 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)str->_M_string_length;
      uVar8 = 0;
      if (((_Var3 != (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0x0) &&
          (_Var4 != (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)startPos)) &&
         ((ulong)_Var4 <= (ulong)_Var3)) {
        uVar6 = 0;
        uVar8 = 0;
        uVar10 = 0;
        do {
          cVar2 = (str->_M_dataplus)._M_p[uVar8 + startPos];
          if ((byte)(cVar2 - 0x3aU) < 0xf6) {
            uVar8 = 0;
            goto LAB_001a961f;
          }
          uVar10 = (uint)(byte)(cVar2 - 0x30) + uVar10 * 10;
          uVar8 = uVar8 + 1;
        } while ((uVar8 & 0xffffffff) < (long)_Var4 - startPos);
        uVar8 = 0x100000000;
        uVar6 = uVar10;
LAB_001a961f:
        uVar8 = uVar6 | uVar8;
      }
      uVar7 = 0;
      if (((_Var3 != (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0x0) &&
          (_Var12 != _Var1)) && ((ulong)_Var12 <= (ulong)_Var3)) {
        uVar6 = 0;
        uVar7 = 1;
        uVar10 = 0;
        do {
          cVar2 = (str->_M_dataplus)._M_p[uVar7 + (long)_Var4];
          if ((byte)(cVar2 - 0x3aU) < 0xf6) {
            _Var4 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0x0;
            goto LAB_001a9677;
          }
          uVar10 = (uint)(byte)(cVar2 - 0x30) + uVar10 * 10;
          uVar9 = uVar7 & 0xffffffff;
          uVar7 = uVar7 + 1;
        } while (uVar9 < (ulong)((long)_Var12 - (long)_Var1));
        _Var4 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0x100000000;
        uVar6 = uVar10;
LAB_001a9677:
        uVar7 = (ulong)uVar6 | (ulong)_Var4;
      }
      uVar5 = 0;
      if (((uVar8 & 0x100000000) != 0) && ((uVar7 & 0x100000000) != 0)) {
        _Var4 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
                (uVar8 & 0xffffffff | uVar7 << 0x20);
        uVar5 = 1;
      }
      goto LAB_001a95b7;
    }
  }
  uVar5 = 0;
LAB_001a95b7:
  oVar13.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._8_4_ = uVar5;
  oVar13.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload = _Var4;
  return (optional<std::pair<unsigned_int,_unsigned_int>_>)
         oVar13.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>;
}

Assistant:

std::optional<std::pair<unsigned int, unsigned int> >
	fractionStrToUint(const std::string & str,
		std::size_t startPos,
		std::size_t length)
{
	//Equivalent regex "(\\d\\d?)/(\\d\\d?)"
	std::optional<std::pair<unsigned int, unsigned int> > error;
	if (length + startPos > str.length()) length = str.length() - startPos;
	const std::size_t endPos = startPos + length;

	const auto slashPos = str.find('/', startPos);
	if (slashPos == std::string::npos) return error;

	static const int minDigits = 1, maxDigits = 2;

	const std::size_t numeratorPos = startPos;
	const std::size_t numeratorLength = slashPos - startPos;
	if (numeratorLength < minDigits || numeratorLength > maxDigits) return error;
	const std::size_t denominatorPos = slashPos + 1;
	const std::size_t denominatorLength = endPos - denominatorPos;
	if (denominatorLength < minDigits || denominatorLength > maxDigits) return error;

	const auto numerator = strToUint(str, numeratorPos, numeratorLength);
	const auto denominator = strToUint(str, denominatorPos, denominatorLength);
	if (!numerator.has_value() || !denominator.has_value()) return error;
	return std::pair(*numerator, *denominator);
}